

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

void Of_ManPrintInit(Of_Man_t *p)

{
  uint uVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  if (p->pPars->fVerbose != 0) {
    printf("LutSize = %d  ",(ulong)(uint)p->pPars->nLutSize);
    printf("CutNum = %d  ",(ulong)(uint)p->pPars->nCutNum);
    printf("Iter = %d  ",(ulong)(uint)(p->pPars->nRoundsEla + p->pPars->nRounds));
    printf("Coarse = %d   ");
    if (p->pPars->fCutMin != 0) {
      printf("Funcs = %d  ");
    }
    piVar2 = p->pGia->pSibls;
    if (piVar2 != (int *)0x0) {
      uVar1 = p->pGia->nObjs;
      uVar4 = 0;
      uVar3 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar3 = uVar4;
      }
      iVar5 = 0;
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        iVar5 = iVar5 + (uint)(0 < piVar2[uVar4]);
      }
      if (iVar5 != 0) {
        printf("Choices = %d  ");
      }
    }
    putchar(10);
    printf("Computing cuts...\r");
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

void Of_ManPrintInit( Of_Man_t * p )
{
    int nChoices;
    if ( !p->pPars->fVerbose )
        return;
    printf( "LutSize = %d  ", p->pPars->nLutSize );
    printf( "CutNum = %d  ",  p->pPars->nCutNum );
    printf( "Iter = %d  ",    p->pPars->nRounds + p->pPars->nRoundsEla );
    printf( "Coarse = %d   ", p->pPars->fCoarsen );
    if ( p->pPars->fCutMin )
    printf( "Funcs = %d  ",   Vec_MemEntryNum(p->vTtMem) );
    nChoices = Gia_ManChoiceNum( p->pGia );
    if ( nChoices )
    printf( "Choices = %d  ", nChoices );
    printf( "\n" );
    printf( "Computing cuts...\r" );
    fflush( stdout );
}